

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MultipleBindingCase::renderTo
          (MultipleBindingCase *this,Surface *dst)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  RenderContext *context;
  Surface *pSVar4;
  int iVar5;
  GLuint GVar6;
  GLuint GVar7;
  GLuint index;
  GLenum GVar8;
  undefined4 extraout_var;
  GLintptr offset;
  GLintptr GVar9;
  void *data;
  CallLogWrapper gl;
  CallLogWrapper local_80;
  Surface *local_68;
  TextureFormat local_60;
  PixelBufferAccess local_58;
  
  iVar5 = (*((this->super_BindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_80,(Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log);
  GVar6 = glu::CallLogWrapper::glGetAttribLocation
                    (&local_80,(((this->super_BindingRenderCase).m_program)->m_program).m_program,
                     "a_position");
  GVar7 = glu::CallLogWrapper::glGetAttribLocation
                    (&local_80,(((this->super_BindingRenderCase).m_program)->m_program).m_program,
                     "a_color");
  index = glu::CallLogWrapper::glGetAttribLocation
                    (&local_80,(((this->super_BindingRenderCase).m_program)->m_program).m_program,
                     "a_offset");
  local_80.m_enableLog = true;
  glu::CallLogWrapper::glClearColor(&local_80,0.0,0.0,0.0,0.0);
  glu::CallLogWrapper::glClear(&local_80,0x4000);
  glu::CallLogWrapper::glViewport(&local_80,0,0,dst->m_width,dst->m_height);
  glu::CallLogWrapper::glBindVertexArray(&local_80,(this->super_BindingRenderCase).m_vao);
  GVar8 = glu::CallLogWrapper::glGetError(&local_80);
  glu::checkError(GVar8,"set vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x276);
  glu::CallLogWrapper::glUseProgram
            (&local_80,(((this->super_BindingRenderCase).m_program)->m_program).m_program);
  GVar8 = glu::CallLogWrapper::glGetError(&local_80);
  glu::checkError(GVar8,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x279);
  glu::CallLogWrapper::glEnableVertexAttribArray(&local_80,GVar6);
  glu::CallLogWrapper::glEnableVertexAttribArray(&local_80,GVar7);
  glu::CallLogWrapper::glEnableVertexAttribArray(&local_80,index);
  glu::CallLogWrapper::glVertexAttribFormat(&local_80,GVar6,4,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat(&local_80,GVar7,4,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat(&local_80,index,4,0x1406,'\0',0x10);
  glu::CallLogWrapper::glVertexAttribBinding(&local_80,GVar6,1);
  glu::CallLogWrapper::glVertexAttribBinding(&local_80,GVar7,2);
  glu::CallLogWrapper::glVertexAttribBinding(&local_80,index,2);
  GVar8 = glu::CallLogWrapper::glGetError(&local_80);
  glu::checkError(GVar8,"setup attribs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x289);
  glu::CallLogWrapper::glVertexBindingDivisor(&local_80,1,0);
  glu::CallLogWrapper::glBindVertexBuffer(&local_80,1,this->m_primitiveBuf,0,0x10);
  bVar1 = (this->m_spec).zeroStride;
  bVar2 = (this->m_spec).instanced;
  bVar3 = (this->m_spec).aliasingBuffers;
  GVar6 = this->m_primitiveBuf;
  GVar7 = this->m_colorOffsetBuf;
  local_68 = dst;
  glu::CallLogWrapper::glVertexBindingDivisor(&local_80,2,(uint)bVar2);
  GVar9 = 0x9600;
  if ((bVar2 & 1U) != 0) {
    GVar9 = 0x60;
  }
  offset = 0;
  if (bVar3 != false) {
    offset = GVar9;
    GVar7 = GVar6;
  }
  glu::CallLogWrapper::glBindVertexBuffer(&local_80,2,GVar7,offset,(uint)(bVar1 ^ 1) << 5);
  GVar8 = glu::CallLogWrapper::glGetError(&local_80);
  pSVar4 = local_68;
  glu::checkError(GVar8,"set binding points",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x29a);
  if ((this->m_spec).instanced == true) {
    glu::CallLogWrapper::glDrawArraysInstanced(&local_80,4,0,6,400);
  }
  else {
    glu::CallLogWrapper::glDrawArrays(&local_80,4,0,0x960);
  }
  GVar8 = glu::CallLogWrapper::glGetError(&local_80);
  glu::checkError(GVar8,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x2a0);
  glu::CallLogWrapper::glFinish(&local_80);
  glu::CallLogWrapper::glBindVertexArray(&local_80,0);
  glu::CallLogWrapper::glUseProgram(&local_80,0);
  GVar8 = glu::CallLogWrapper::glGetError(&local_80);
  glu::checkError(GVar8,"clean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x2a5);
  context = ((this->super_BindingRenderCase).super_TestCase.m_context)->m_renderCtx;
  local_60.order = RGBA;
  local_60.type = UNORM_INT8;
  data = (void *)(pSVar4->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (pSVar4->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,&local_60,pSVar4->m_width,pSVar4->m_height,1,data);
  glu::readPixels(context,0,0,&local_58);
  glu::CallLogWrapper::~CallLogWrapper(&local_80);
  return;
}

Assistant:

void MultipleBindingCase::renderTo (tcu::Surface& dst)
{
	glu::CallLogWrapper gl					(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	const int			positionLoc			= gl.glGetAttribLocation(m_program->getProgram(), "a_position");
	const int			colorLoc			= gl.glGetAttribLocation(m_program->getProgram(), "a_color");
	const int			offsetLoc			= gl.glGetAttribLocation(m_program->getProgram(), "a_offset");

	const int			positionBinding		= 1;
	const int			colorOffsetBinding	= 2;

	gl.enableLogging(true);

	gl.glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
	gl.glClear(GL_COLOR_BUFFER_BIT);
	gl.glViewport(0, 0, dst.getWidth(), dst.getHeight());
	gl.glBindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "set vao");

	gl.glUseProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "use program");

	// Setup format & binding

	gl.glEnableVertexAttribArray(positionLoc);
	gl.glEnableVertexAttribArray(colorLoc);
	gl.glEnableVertexAttribArray(offsetLoc);

	gl.glVertexAttribFormat(positionLoc, 4, GL_FLOAT, GL_FALSE, 0);
	gl.glVertexAttribFormat(colorLoc, 4, GL_FLOAT, GL_FALSE, 0);
	gl.glVertexAttribFormat(offsetLoc, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4));

	gl.glVertexAttribBinding(positionLoc, positionBinding);
	gl.glVertexAttribBinding(colorLoc, colorOffsetBinding);
	gl.glVertexAttribBinding(offsetLoc, colorOffsetBinding);

	GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup attribs");

	// setup binding points

	gl.glVertexBindingDivisor(positionBinding, 0);
	gl.glBindVertexBuffer(positionBinding, m_primitiveBuf, 0, sizeof(tcu::Vec4));

	{
		const int			stride	= (m_spec.zeroStride) ? (0) : (2 * (int)sizeof(tcu::Vec4));
		const int			offset	= (!m_spec.aliasingBuffers) ? (0) : (m_spec.instanced) ? (6 * (int)sizeof(tcu::Vec4)) : (6 * GRID_SIZE * GRID_SIZE * (int)sizeof(tcu::Vec4));
		const glw::GLuint	buffer	= (m_spec.aliasingBuffers) ? (m_primitiveBuf) : (m_colorOffsetBuf);
		const int			divisor	= (m_spec.instanced) ? (1) : (0);

		gl.glVertexBindingDivisor(colorOffsetBinding, divisor);
		gl.glBindVertexBuffer(colorOffsetBinding, buffer, offset, (glw::GLsizei)stride);
	}

	GLU_EXPECT_NO_ERROR(gl.glGetError(), "set binding points");

	if (m_spec.instanced)
		gl.glDrawArraysInstanced(GL_TRIANGLES, 0, 6, GRID_SIZE*GRID_SIZE);
	else
		gl.glDrawArrays(GL_TRIANGLES, 0, GRID_SIZE*GRID_SIZE*6);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "draw");

	gl.glFinish();
	gl.glBindVertexArray(0);
	gl.glUseProgram(0);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "clean");

	glu::readPixels(m_context.getRenderContext(), 0, 0, dst.getAccess());
}